

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::FiberStack::~FiberStack(FiberStack *this)

{
  FiberStack *this_local;
  
  Impl::free(this->impl,(void *)this->stackSize);
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>::~OneOf(&this->main);
  return;
}

Assistant:

FiberStack::~FiberStack() noexcept(false) {
#if KJ_USE_FIBERS
#if _WIN32 || __CYGWIN__
  DeleteFiber(osFiber);
#else
  Impl::free(impl, stackSize);
#endif
#endif
}